

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.cc
# Opt level: O2

ostream * operator<<(ostream *os,substring *ss)

{
  ostream *poVar1;
  string s;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_30,ss->begin,ss->end);
  poVar1 = std::operator<<(os,(string *)local_30);
  std::__cxx11::string::~string((string *)local_30);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const substring& ss)
{
  std::string s(ss.begin, ss.end - ss.begin);
  return os << s;
}